

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

int stb_ischar(char c,char *set)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  int local_6c;
  int local_64;
  int local_54;
  int local_44;
  int local_3c;
  int local_2c;
  int f;
  int j;
  int n;
  int k;
  int i;
  int z;
  char *set_local;
  char c_local;
  
  k = stb_perfect_hash(&stb_ischar::p,(uint)set);
  if (k < 0) {
    if (set == (char *)0x0) {
      stb_arr_free_(&stb_ischar::sets);
      free(stb_ischar::tables);
      stb_ischar::tables = (uchar (*) [256])0x0;
      stb_perfect_destroy(&stb_ischar::p);
      return 0;
    }
    if (stb_ischar::sets == (char **)0x0) {
      local_3c = 0;
    }
    else {
      local_3c = *(int *)(stb_ischar::sets + -2);
    }
    if (stb_ischar::sets == (char **)0x0) {
      local_44 = 0;
    }
    else {
      local_44 = *(int *)((long)stb_ischar::sets + -0xc);
    }
    if (local_44 < local_3c + 1) {
      stb__arr_addlen_(&stb_ischar::sets,8,1);
    }
    else {
      *(int *)(stb_ischar::sets + -2) = *(int *)(stb_ischar::sets + -2) + 1;
    }
    if (stb_ischar::sets == (char **)0x0) {
      local_54 = 0;
    }
    else {
      local_54 = *(int *)(stb_ischar::sets + -2);
    }
    stb_ischar::sets[(long)local_54 + -1] = set;
    stb_perfect_destroy(&stb_ischar::p);
    if (stb_ischar::sets == (char **)0x0) {
      local_64 = 0;
    }
    else {
      local_64 = *(int *)(stb_ischar::sets + -2);
    }
    iVar2 = stb_perfect_create(&stb_ischar::p,(uint *)stb_ischar::sets,local_64);
    if (iVar2 == 0) {
      __assert_fail("n != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                    ,0xea6,"int stb_ischar(char, char *)");
    }
    iVar2 = iVar2 + 7 >> 3;
    stb_ischar::tables = (uchar (*) [256])realloc(stb_ischar::tables,(long)iVar2 << 8);
    memset(stb_ischar::tables,0,(long)iVar2 << 8);
    n = 0;
    while( true ) {
      if (stb_ischar::sets == (char **)0x0) {
        local_6c = 0;
      }
      else {
        local_6c = *(int *)(stb_ischar::sets + -2);
      }
      if (local_6c <= n) break;
      uVar3 = stb_perfect_hash(&stb_ischar::p,(uint)stb_ischar::sets[n]);
      if ((int)uVar3 < 0) {
        __assert_fail("k >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                      ,0xeac,"int stb_ischar(char, char *)");
      }
      bVar1 = stb_ischar::bit[(int)(uVar3 & 7)];
      local_2c = 0;
      while( true ) {
        bVar4 = true;
        if (local_2c != 0) {
          bVar4 = stb_ischar::sets[n][local_2c] != '\0';
        }
        if (!bVar4) break;
        stb_ischar::tables[(int)uVar3 >> 3][(byte)stb_ischar::sets[n][local_2c]] =
             stb_ischar::tables[(int)uVar3 >> 3][(byte)stb_ischar::sets[n][local_2c]] | bVar1;
        local_2c = local_2c + 1;
      }
      n = n + 1;
    }
    k = stb_perfect_hash(&stb_ischar::p,(uint)set);
  }
  return (uint)(stb_ischar::tables[k >> 3][(byte)c] & stb_ischar::bit[(int)(k & 7)]);
}

Assistant:

int stb_ischar(char c, char *set)
{
   static unsigned char bit[8] = { 1,2,4,8,16,32,64,128 };
   static stb_perfect p;
   static unsigned char (*tables)[256];
   static char ** sets = NULL;

   int z = stb_perfect_hash(&p, (int) set);
   if (z < 0) {
      int i,k,n,j,f;
      // special code that means free all existing data
      if (set == NULL) {
         stb_arr_free(sets);
         free(tables);
         tables = NULL;
         stb_perfect_destroy(&p);
         return 0;
      }
      stb_arr_push(sets, set);
      stb_perfect_destroy(&p);
      n = stb_perfect_create(&p, (unsigned int *) (char **) sets, stb_arr_len(sets));
      assert(n != 0);
      k = (n+7) >> 3;
      tables = (unsigned char (*)[256]) realloc(tables, sizeof(*tables) * k);
      memset(tables, 0, sizeof(*tables) * k);
      for (i=0; i < stb_arr_len(sets); ++i) {
         k = stb_perfect_hash(&p, (int) sets[i]);
         assert(k >= 0);
         n = k >> 3;
         f = bit[k&7];
         for (j=0; !j || sets[i][j]; ++j) {
            tables[n][(unsigned char) sets[i][j]] |= f;
         }
      }
      z = stb_perfect_hash(&p, (int) set);
   }
   return tables[z >> 3][(unsigned char) c] & bit[z & 7];
}